

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void remove_damage(monst *shkp,boolean croaked)

{
  char cVar1;
  char y;
  level *lev;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  xchar xVar6;
  boolean bVar7;
  char cVar8;
  byte bVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  damage *pdVar14;
  int y_00;
  uint uVar15;
  damage *tmp_dam;
  int x;
  char shops [5];
  char local_3d;
  char local_3c;
  rm (*local_38) [21];
  
  xVar6 = ledger_no((d_level *)&shkp[0x1b].mxlth);
  lev = levels[xVar6];
  tmp_dam = lev->damagelist;
  if (tmp_dam == (damage *)0x0) {
    return;
  }
  local_38 = lev->locations;
  pdVar14 = (damage *)0x0;
  bVar2 = false;
  bVar9 = 0;
  bVar3 = false;
  cVar8 = '\0';
  bVar5 = false;
  bVar4 = false;
  do {
    cVar1 = (tmp_dam->place).x;
    x = (int)cVar1;
    y = (tmp_dam->place).y;
    y_00 = (int)y;
    pcVar11 = in_rooms(lev,cVar1,y,0x12);
    strcpy(&local_3d,pcVar11);
    pcVar11 = strchr(&local_3d,(int)(char)shkp[0x1b].meating);
    if (pcVar11 == (char *)0x0) {
LAB_00239d3d:
      pdVar14 = tmp_dam;
      tmp_dam = tmp_dam->next;
    }
    else {
      if (croaked == '\0') {
        if (cVar8 == '\0') {
          bVar7 = closed_door(lev,x,y_00);
          if (bVar7 == '\0') {
            cVar8 = '\0';
          }
          else {
            cVar8 = picking_at(x,y_00);
          }
          uVar10 = repair_damage(lev,shkp,tmp_dam,'\0');
          if (uVar10 == 0) {
            cVar8 = '\0';
          }
        }
        else {
          uVar10 = repair_damage(lev,shkp,tmp_dam,'\0');
        }
      }
      else {
        uVar10 = (uint)(local_3c == '\0');
      }
      if (uVar10 != 1) {
        if (uVar10 == 0) goto LAB_00239d3d;
        if ((viz_array[y_00][x] & 2U) == 0) {
          bVar2 = true;
        }
        else {
          cVar1 = local_38[x][y_00].typ;
          if (cVar1 < '\r' && cVar1 != '\0') {
            bVar2 = true;
            bVar9 = bVar9 + 1;
          }
          else if (cVar1 == '\x17') {
            bVar2 = true;
            bVar4 = true;
          }
          else {
            bVar2 = true;
            if (uVar10 == 3) {
              bVar3 = true;
            }
            else {
              bVar5 = true;
            }
          }
        }
      }
      tmp_dam = tmp_dam->next;
      if (pdVar14 == (damage *)0x0) {
        free(lev->damagelist);
        lev->damagelist = tmp_dam;
        pdVar14 = (damage *)0x0;
      }
      else {
        free(pdVar14->next);
        pdVar14->next = tmp_dam;
      }
    }
  } while (tmp_dam != (damage *)0x0);
  if (!bVar2) {
    return;
  }
  if (bVar9 == 0) {
    if (bVar4) {
      pcVar11 = "Suddenly, the shop door reappears!";
    }
    else if (bVar5) {
      pcVar11 = "Suddenly, the floor damage is gone!";
    }
    else if (bVar3) {
      pcVar11 = "Suddenly, the trap is removed from the floor!";
    }
    else {
      uVar10 = *(uint *)&level->locations[u.ux][u.uy].field_0x6;
      uVar15 = uVar10 >> 0x10 & 0x3f;
      bVar9 = 0;
      if ((uVar10 >> 0x16 & 1) == 0 && 2 < uVar15) {
        bVar9 = 0;
        if ('\x11' < level->rooms[uVar15 - 3].rtype) {
          bVar9 = (byte)(uVar10 >> 0x10) & 0x3f;
        }
      }
      if (bVar9 != (byte)shkp[0x1b].meating) {
        if ((flags.soundok != '\0') &&
           (uVar10 = mt_random(),
           (uVar10 * -0x33333333 >> 1 | (uint)((uVar10 * -0x33333333 & 1) != 0) << 0x1f) <
           0x1999999a)) {
          Norep("The dungeon acoustics noticeably change.");
        }
        goto LAB_00239ebf;
      }
      pcVar11 = "You feel more claustrophobic than before.";
    }
  }
  else {
    if (bVar9 == 1) {
      pcVar11 = "a";
      pcVar13 = "";
      pcVar12 = "s";
    }
    else {
      pcVar11 = "several";
      if (bVar9 < 4) {
        pcVar11 = "some";
      }
      pcVar13 = "s";
      pcVar12 = "";
    }
    pline("Suddenly, %s section%s of wall close%s up!",pcVar11,pcVar13,pcVar12);
    if (bVar4) {
      pline("The shop door reappears!");
    }
    if (!bVar5) goto LAB_00239ebf;
    pcVar11 = "The floor is repaired!";
  }
  pline(pcVar11);
LAB_00239ebf:
  if (cVar8 != '\0') {
    stop_occupation();
  }
  return;
}

Assistant:

static void remove_damage(struct monst *shkp, boolean croaked)
{
	struct damage *tmp_dam, *tmp2_dam;
	boolean did_repair = FALSE, saw_door = FALSE;
	boolean saw_floor = FALSE, stop_picking = FALSE;
	boolean saw_untrap = FALSE;
	uchar saw_walls = 0;
	struct level *lev = levels[ledger_no(&ESHK(shkp)->shoplevel)];

	tmp_dam = lev->damagelist;
	tmp2_dam = 0;
	while (tmp_dam) {
	    xchar x = tmp_dam->place.x, y = tmp_dam->place.y;
	    char shops[5];
	    int disposition;

	    disposition = 0;
	    strcpy(shops, in_rooms(lev, x, y, SHOPBASE));
	    if (strchr(shops, ESHK(shkp)->shoproom)) {
		if (croaked)
		    disposition = (shops[1])? 0 : 1;
		else if (stop_picking)
		    disposition = repair_damage(lev, shkp, tmp_dam, FALSE);
		else {
		    /* Defer the stop_occupation() until after repair msgs */
		    if (closed_door(lev, x, y))
			stop_picking = picking_at(x, y);
		    disposition = repair_damage(lev, shkp, tmp_dam, FALSE);
		    if (!disposition)
			stop_picking = FALSE;
		}
	    }

	    if (!disposition) {
		tmp2_dam = tmp_dam;
		tmp_dam = tmp_dam->next;
		continue;
	    }

	    if (disposition > 1) {
		did_repair = TRUE;
		if (cansee(x, y)) {
		    if (IS_WALL(lev->locations[x][y].typ))
			saw_walls++;
		    else if (IS_DOOR(lev->locations[x][y].typ))
			saw_door = TRUE;
		    else if (disposition == 3)		/* untrapped */
			saw_untrap = TRUE;
		    else
			saw_floor = TRUE;
		}
	    }

	    tmp_dam = tmp_dam->next;
	    if (!tmp2_dam) {
		free(lev->damagelist);
		lev->damagelist = tmp_dam;
	    } else {
		free(tmp2_dam->next);
		tmp2_dam->next = tmp_dam;
	    }
	}
	if (!did_repair)
	    return;
	if (saw_walls) {
	    pline("Suddenly, %s section%s of wall close%s up!",
		  (saw_walls == 1) ? "a" : (saw_walls <= 3) ?
						  "some" : "several",
		  (saw_walls == 1) ? "" : "s", (saw_walls == 1) ? "s" : "");
	    if (saw_door)
		pline("The shop door reappears!");
	    if (saw_floor)
		pline("The floor is repaired!");
	} else {
	    if (saw_door)
		pline("Suddenly, the shop door reappears!");
	    else if (saw_floor)
		pline("Suddenly, the floor damage is gone!");
	    else if (saw_untrap)
	        pline("Suddenly, the trap is removed from the floor!");
	    else if (inside_shop(level, u.ux, u.uy) == ESHK(shkp)->shoproom)
		pline("You feel more claustrophobic than before.");
	    else if (flags.soundok && !rn2(10))
		Norep("The dungeon acoustics noticeably change.");
	}
	if (stop_picking)
		stop_occupation();
}